

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O0

CommPtr __thiscall Omega_h::Comm::graph_inverse(Comm *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Read<int> *in_RSI;
  CommPtr CVar1;
  undefined1 local_38 [40];
  Comm *this_local;
  
  this_local = this;
  destinations((Comm *)(local_38 + 0x10));
  sources((Comm *)local_38);
  graph_adjacent(this,in_RSI,(Read<int> *)(local_38 + 0x10));
  Read<int>::~Read((Read<int> *)local_38);
  Read<int>::~Read((Read<int> *)(local_38 + 0x10));
  CVar1.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  CVar1.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (CommPtr)CVar1.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CommPtr Comm::graph_inverse() const {
  return graph_adjacent(destinations(), sources());
}